

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

size_t __thiscall
backward::StackTraceImpl<backward::system_tag::linux_tag>::load_from
          (StackTraceImpl<backward::system_tag::linux_tag> *this,void *addr,size_t depth,
          void *context,void *error_addr)

{
  vector<void_*,_std::allocator<void_*>_> *pvVar1;
  reference ppvVar2;
  size_type __new_size;
  size_t sVar3;
  StackTraceImplHolder *this_00;
  long in_RDX;
  value_type in_RSI;
  StackTraceImplBase *in_RDI;
  StackTraceImpl<backward::system_tag::linux_tag> *in_R8;
  size_t i;
  void *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  vector<void_*,_std::allocator<void_*>_> *pvVar4;
  vector<void_*,_std::allocator<void_*>_> *this_01;
  
  load_here(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pvVar4 = (vector<void_*,_std::allocator<void_*>_> *)0x0;
  do {
    this_01 = pvVar4;
    pvVar1 = (vector<void_*,_std::allocator<void_*>_> *)
             std::vector<void_*,_std::allocator<void_*>_>::size
                       ((vector<void_*,_std::allocator<void_*>_> *)(in_RDI + 1));
    if (pvVar1 <= pvVar4) {
LAB_001d888d:
      __new_size = std::vector<void_*,_std::allocator<void_*>_>::size
                             ((vector<void_*,_std::allocator<void_*>_> *)(in_RDI + 1));
      sVar3 = StackTraceImplBase::skip_n_firsts(in_RDI);
      this_00 = (StackTraceImplHolder *)(sVar3 + in_RDX);
      Catch::clara::std::min<unsigned_long>
                ((unsigned_long *)&stack0xffffffffffffffc8,(unsigned_long *)&stack0xffffffffffffffc0
                );
      std::vector<void_*,_std::allocator<void_*>_>::resize(this_01,__new_size);
      sVar3 = StackTraceImplHolder::size(this_00);
      return sVar3;
    }
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)(in_RDI + 1),(size_type)this_01)
    ;
    if (*ppvVar2 == in_RSI) {
      StackTraceImplBase::skip_n_firsts(in_RDI,(size_t)this_01);
      goto LAB_001d888d;
    }
    pvVar4 = (vector<void_*,_std::allocator<void_*>_> *)
             ((long)&(this_01->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

size_t load_from(void *addr, size_t depth = 32, void *context = nullptr,
                   void *error_addr = nullptr) {
    load_here(depth + 8, context, error_addr);

    for (size_t i = 0; i < _stacktrace.size(); ++i) {
      if (_stacktrace[i] == addr) {
        skip_n_firsts(i);
        break;
      }
    }

    _stacktrace.resize((std::min)(_stacktrace.size(), skip_n_firsts() + depth));
    return size();
  }